

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O3

void melee_effect_handler_EAT_GOLD(melee_effect_handler_context_t *context)

{
  uint32_t *puVar1;
  int iVar2;
  player *ppVar3;
  _Bool _Var4;
  uint8_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  object *obj;
  object_kind *k;
  uint uVar8;
  wchar_t value;
  ulong uVar9;
  wchar_t wVar10;
  
  ppVar3 = context->p;
  _Var4 = monster_damage_target(context,true);
  if (!_Var4) {
    context->obvious = true;
    if ((ppVar3->timed[3] == 0) &&
       (uVar6 = Rand_div(100),
       (int)uVar6 < (int)ppVar3->lev + adj_dex_safe[(ppVar3->state).stat_ind[3]])) {
      msg("You quickly protect your money pouch!");
      uVar6 = Rand_div(3);
      if (uVar6 == 0) {
        return;
      }
    }
    else {
      iVar2 = ppVar3->au;
      uVar6 = Rand_div(0x19);
      uVar7 = uVar6 + iVar2 / 10 + 1;
      uVar8 = 2;
      if (2 < (int)uVar7) {
        uVar8 = uVar7;
      }
      if (5000 < (int)uVar7) {
        iVar2 = ppVar3->au;
        uVar6 = Rand_div(3000);
        uVar8 = uVar6 + iVar2 / 0x14 + 1;
      }
      uVar7 = ppVar3->au;
      if ((int)uVar7 <= (int)uVar8) {
        uVar8 = uVar7;
      }
      uVar9 = (ulong)uVar8;
      ppVar3->au = uVar7 - uVar8;
      if ((int)uVar8 < 1) {
        msg("Nothing was stolen.");
        return;
      }
      msg("Your purse feels lighter.");
      if (ppVar3->au == 0) {
        msg("All of your coins were stolen!");
      }
      else {
        msg("%d coins were stolen!",uVar9);
      }
      do {
        obj = object_new();
        value = (wchar_t)uVar9;
        k = money_kind("gold",value);
        object_prep(obj,k,L'\0',MINIMISE);
        wVar10 = L'翿';
        if ((uint)value < 0x7fff) {
          wVar10 = value;
        }
        obj->pval = (int16_t)wVar10;
        obj->origin = '\x11';
        uVar5 = convert_depth_to_origin((int)ppVar3->depth);
        obj->origin_depth = uVar5;
        obj->origin_place = ppVar3->place;
        monster_carry((chunk *)cave,context->mon,obj);
        uVar9 = (ulong)(uint)(value - wVar10);
      } while (value - wVar10 != 0 && wVar10 <= value);
      puVar1 = &ppVar3->upkeep->redraw;
      *puVar1 = *puVar1 | 0x100;
    }
    context->blinked = true;
  }
  return;
}

Assistant:

static void melee_effect_handler_EAT_GOLD(melee_effect_handler_context_t *context)
{
	struct player *current_player = context->p;

	/* Take damage */
	if (monster_damage_target(context, true)) return;

    /* Obvious */
    context->obvious = true;

    /* Attempt saving throw (unless paralyzed) based on dex and level */
    if (!current_player->timed[TMD_PARALYZED] &&
        (randint0(100) < (adj_dex_safe[current_player->state.stat_ind[STAT_DEX]]
						  + current_player->lev))) {
        /* Saving throw message */
        msg("You quickly protect your money pouch!");

        /* Occasional blink anyway */
        if (randint0(3)) context->blinked = true;
    } else {
        int32_t gold = (current_player->au / 10) + randint1(25);
        if (gold < 2) gold = 2;
        if (gold > 5000) gold = (current_player->au / 20) + randint1(3000);
        if (gold > current_player->au) gold = current_player->au;
        current_player->au -= gold;
        if (gold <= 0) {
            msg("Nothing was stolen.");
            return;
        }

        /* Let the player know they were robbed */
        msg("Your purse feels lighter.");
        if (current_player->au)
            msg("%d coins were stolen!", gold);
        else
            msg("All of your coins were stolen!");

        /* While we have gold, put it in objects */
        while (gold > 0) {
            int amt;

            /* Create a new temporary object */
            struct object *obj = object_new();
            object_prep(obj, money_kind("gold", gold), 0, MINIMISE);

            /* Amount of gold to put in this object */
            amt = gold > MAX_PVAL ? MAX_PVAL : gold;
            obj->pval = amt;
            gold -= amt;

            /* Set origin to stolen, so it is not confused with
             * dropped treasure in monster_death */
            obj->origin = ORIGIN_STOLEN;
			obj->origin_depth = convert_depth_to_origin(current_player->depth);
			obj->origin_place = current_player->place;

            /* Give the gold to the monster */
            monster_carry(cave, context->mon, obj);
        }

        /* Redraw gold */
        current_player->upkeep->redraw |= (PR_GOLD);

        /* Blink away */
        context->blinked = true;
    }
}